

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

void parse_example_tweaks(options_i *options,vw *all)

{
  int iVar1;
  long *plVar2;
  byte bVar3;
  uint32_t uVar4;
  typed_option<unsigned_long> *label_list;
  vw *all_00;
  option_group_definition *funcName;
  ostream *poVar5;
  namedlabels *pnVar6;
  loss_function *plVar7;
  void *pvVar8;
  long *in_RSI;
  long *in_RDI;
  option_group_definition example_options;
  bool test_only;
  size_t early_terminate_passes;
  float loss_parameter;
  string loss_function;
  string named_labels;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffe008;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffe010;
  string *in_stack_ffffffffffffe018;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffe020;
  byte local_1fb9;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffe058;
  option_group_definition *in_stack_ffffffffffffe060;
  byte local_1f12;
  allocator *paVar9;
  float function_parameter;
  namedlabels *this;
  allocator local_1c91;
  string local_1c90 [32];
  string local_1c70 [32];
  string local_1c50 [39];
  allocator local_1c29;
  string local_1c28 [37];
  byte local_1c03;
  byte local_1c02;
  allocator local_1c01;
  string local_1c00 [39];
  allocator local_1bd9;
  string local_1bd8 [39];
  allocator local_1bb1;
  string local_1bb0 [39];
  allocator local_1b89;
  string local_1b88 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b68 [2];
  allocator local_1a21;
  string local_1a20 [39];
  allocator local_19f9;
  string local_19f8 [359];
  allocator local_1891;
  string local_1890 [39];
  allocator local_1869;
  string local_1868 [359];
  allocator local_1701;
  string local_1700 [39];
  allocator local_16d9;
  string local_16d8 [359];
  allocator local_1571;
  string local_1570 [39];
  allocator local_1549;
  string local_1548 [359];
  allocator local_13e1;
  string local_13e0 [39];
  allocator local_13b9;
  string local_13b8 [39];
  allocator local_1391;
  string local_1390 [359];
  allocator local_1229;
  string local_1228 [39];
  allocator local_1201;
  string local_1200 [359];
  allocator local_1099;
  string local_1098 [39];
  allocator local_1071;
  string local_1070 [359];
  allocator local_f09;
  string local_f08 [39];
  allocator local_ee1;
  string local_ee0 [359];
  allocator local_d79;
  string local_d78 [39];
  allocator local_d51;
  string local_d50 [359];
  allocator local_be9;
  string local_be8 [39];
  allocator local_bc1;
  string local_bc0 [359];
  allocator local_a59;
  string local_a58 [39];
  allocator local_a31;
  string local_a30 [359];
  undefined1 local_8c9 [40];
  allocator local_8a1;
  string local_8a0 [359];
  allocator local_739;
  string local_738 [39];
  allocator local_711;
  string local_710 [359];
  allocator local_5a9;
  string local_5a8 [39];
  allocator local_581;
  string local_580 [359];
  allocator local_419;
  string local_418 [39];
  allocator local_3f1;
  string local_3f0 [359];
  allocator local_289;
  string local_288 [39];
  allocator local_261;
  string local_260 [39];
  allocator local_239;
  string local_238 [375];
  allocator local_c1;
  string local_c0 [32];
  undefined1 local_a0 [63];
  byte local_61;
  undefined4 local_54;
  string local_50 [32];
  string local_30 [32];
  long *local_10;
  long *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  local_54 = 0;
  local_61 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"Example options",&local_c1);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffe010,
             (string *)in_stack_ffffffffffffe008);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"testonly",&local_239);
  VW::config::make_option<bool>(in_stack_ffffffffffffe018,(bool *)in_stack_ffffffffffffe010);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"t",&local_261);
  VW::config::typed_option<bool>::short_name
            ((typed_option<bool> *)in_stack_ffffffffffffe010,(string *)in_stack_ffffffffffffe008);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_288,"Ignore label information and just test",&local_289);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe010,(string *)in_stack_ffffffffffffe008);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffe010,
             (typed_option<bool> *)in_stack_ffffffffffffe008);
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffe060,(typed_option<bool> *)in_stack_ffffffffffffe058);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f0,"holdout_off",&local_3f1);
  VW::config::make_option<bool>(in_stack_ffffffffffffe018,(bool *)in_stack_ffffffffffffe010);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_418,"no holdout data in multiple passes",&local_419);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe010,(string *)in_stack_ffffffffffffe008);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffe010,
             (typed_option<bool> *)in_stack_ffffffffffffe008);
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffe060,(typed_option<bool> *)in_stack_ffffffffffffe058);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_580,"holdout_period",&local_581);
  VW::config::make_option<unsigned_int>(in_stack_ffffffffffffe018,(uint *)in_stack_ffffffffffffe010)
  ;
  VW::config::typed_option<unsigned_int>::default_value
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe020,
             (uint)((ulong)in_stack_ffffffffffffe018 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5a8,"holdout period for test only",&local_5a9);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe010,
             (string *)in_stack_ffffffffffffe008);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe010,
             (typed_option<unsigned_int> *)in_stack_ffffffffffffe008);
  VW::config::option_group_definition::add<unsigned_int>
            (in_stack_ffffffffffffe060,(typed_option<unsigned_int> *)in_stack_ffffffffffffe058);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_710,"holdout_after",&local_711);
  VW::config::make_option<unsigned_int>(in_stack_ffffffffffffe018,(uint *)in_stack_ffffffffffffe010)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_738,"holdout after n training examples, default off (disables holdout_period)",
             &local_739);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe010,
             (string *)in_stack_ffffffffffffe008);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe010,
             (typed_option<unsigned_int> *)in_stack_ffffffffffffe008);
  VW::config::option_group_definition::add<unsigned_int>
            (in_stack_ffffffffffffe060,(typed_option<unsigned_int> *)in_stack_ffffffffffffe058);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8a0,"early_terminate",&local_8a1);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffe018,(unsigned_long *)in_stack_ffffffffffffe010);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe020,
             (unsigned_long)in_stack_ffffffffffffe018);
  this = (namedlabels *)local_8c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_8c9 + 1),
             "Specify the number of passes tolerated when holdout loss doesn\'t decrease before early termination"
             ,(allocator *)this);
  label_list = VW::config::typed_option<unsigned_long>::help
                         ((typed_option<unsigned_long> *)in_stack_ffffffffffffe010,
                          (string *)in_stack_ffffffffffffe008);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe010,
             (typed_option<unsigned_long> *)in_stack_ffffffffffffe008);
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_ffffffffffffe060,(typed_option<unsigned_long> *)in_stack_ffffffffffffe058);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a30,"passes",&local_a31);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffe018,(unsigned_long *)in_stack_ffffffffffffe010);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a58,"Number of Training Passes",&local_a59);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe010,
             (string *)in_stack_ffffffffffffe008);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe010,
             (typed_option<unsigned_long> *)in_stack_ffffffffffffe008);
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_ffffffffffffe060,(typed_option<unsigned_long> *)in_stack_ffffffffffffe058);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bc0,"initial_pass_length",&local_bc1);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffe018,(unsigned_long *)in_stack_ffffffffffffe010);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_be8,"initial number of examples per pass",&local_be9);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe010,
             (string *)in_stack_ffffffffffffe008);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe010,
             (typed_option<unsigned_long> *)in_stack_ffffffffffffe008);
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_ffffffffffffe060,(typed_option<unsigned_long> *)in_stack_ffffffffffffe058);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d50,"examples",&local_d51);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffe018,(unsigned_long *)in_stack_ffffffffffffe010);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d78,"number of examples to parse",&local_d79);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe010,
             (string *)in_stack_ffffffffffffe008);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe010,
             (typed_option<unsigned_long> *)in_stack_ffffffffffffe008);
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_ffffffffffffe060,(typed_option<unsigned_long> *)in_stack_ffffffffffffe058);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ee0,"min_prediction",&local_ee1);
  VW::config::make_option<float>(in_stack_ffffffffffffe018,(float *)in_stack_ffffffffffffe010);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f08,"Smallest prediction to output",&local_f09);
  all_00 = (vw *)VW::config::typed_option<float>::help
                           ((typed_option<float> *)in_stack_ffffffffffffe010,
                            (string *)in_stack_ffffffffffffe008);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffe010,
             (typed_option<float> *)in_stack_ffffffffffffe008);
  funcName = VW::config::option_group_definition::add<float>
                       (in_stack_ffffffffffffe060,(typed_option<float> *)in_stack_ffffffffffffe058);
  paVar9 = &local_1071;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1070,"max_prediction",paVar9);
  function_parameter = (float)((ulong)paVar9 >> 0x20);
  VW::config::make_option<float>(in_stack_ffffffffffffe018,(float *)in_stack_ffffffffffffe010);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1098,"Largest prediction to output",&local_1099);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe010,(string *)in_stack_ffffffffffffe008);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffe010,
             (typed_option<float> *)in_stack_ffffffffffffe008);
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffe060,(typed_option<float> *)in_stack_ffffffffffffe058);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1200,"sort_features",&local_1201);
  VW::config::make_option<bool>(in_stack_ffffffffffffe018,(bool *)in_stack_ffffffffffffe010);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1228,
             "turn this on to disregard order in which features have been defined. This will lead to smaller cache sizes"
             ,&local_1229);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe010,(string *)in_stack_ffffffffffffe008);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffe010,
             (typed_option<bool> *)in_stack_ffffffffffffe008);
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffe060,(typed_option<bool> *)in_stack_ffffffffffffe058);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1390,"loss_function",&local_1391);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffe018,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_13b8,"squared",&local_13b9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  default_value(in_stack_ffffffffffffe020,in_stack_ffffffffffffe018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_13e0,
             "Specify the loss function to be used, uses squared by default. Currently available ones are squared, classic, hinge, logistic, quantile and poisson."
             ,&local_13e1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffe010,(string *)in_stack_ffffffffffffe008);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(in_stack_ffffffffffffe010,in_stack_ffffffffffffe008);
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_ffffffffffffe060,in_stack_ffffffffffffe058);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1548,"quantile_tau",&local_1549);
  VW::config::make_option<float>(in_stack_ffffffffffffe018,(float *)in_stack_ffffffffffffe010);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)in_stack_ffffffffffffe020,
             (float)((ulong)in_stack_ffffffffffffe018 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1570,"Parameter \\tau associated with Quantile loss. Defaults to 0.5",&local_1571
            );
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe010,(string *)in_stack_ffffffffffffe008);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffe010,
             (typed_option<float> *)in_stack_ffffffffffffe008);
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffe060,(typed_option<float> *)in_stack_ffffffffffffe058);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16d8,"l1",&local_16d9);
  VW::config::make_option<float>(in_stack_ffffffffffffe018,(float *)in_stack_ffffffffffffe010);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1700,"l_1 lambda",&local_1701);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe010,(string *)in_stack_ffffffffffffe008);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffe010,
             (typed_option<float> *)in_stack_ffffffffffffe008);
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffe060,(typed_option<float> *)in_stack_ffffffffffffe058);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1868,"l2",&local_1869);
  VW::config::make_option<float>(in_stack_ffffffffffffe018,(float *)in_stack_ffffffffffffe010);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1890,"l_2 lambda",&local_1891);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe010,(string *)in_stack_ffffffffffffe008);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffe010,
             (typed_option<float> *)in_stack_ffffffffffffe008);
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffe060,(typed_option<float> *)in_stack_ffffffffffffe058);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_19f8,"no_bias_regularization",&local_19f9);
  VW::config::make_option<bool>(in_stack_ffffffffffffe018,(bool *)in_stack_ffffffffffffe010);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a20,"no bias in regularization",&local_1a21);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe010,(string *)in_stack_ffffffffffffe008);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffe010,
             (typed_option<bool> *)in_stack_ffffffffffffe008);
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffe060,(typed_option<bool> *)in_stack_ffffffffffffe058);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b88,"named_labels",&local_1b89);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffe018,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(local_1b68,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1bb0,
             "use names for labels (multiclass, etc.) rather than integers, argument specified all possible labels, comma-sep, eg \"--named_labels Noun,Verb,Adj,Punc\""
             ,&local_1bb1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffe010,(string *)in_stack_ffffffffffffe008);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(in_stack_ffffffffffffe010,in_stack_ffffffffffffe008);
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_ffffffffffffe060,in_stack_ffffffffffffe058);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_1bb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bb1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_1b88);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b89);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_1a20);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a21);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_19f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_19f9);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_1890);
  std::allocator<char>::~allocator((allocator<char> *)&local_1891);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_1868);
  std::allocator<char>::~allocator((allocator<char> *)&local_1869);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_1700);
  std::allocator<char>::~allocator((allocator<char> *)&local_1701);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_16d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_16d9);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_1570);
  std::allocator<char>::~allocator((allocator<char> *)&local_1571);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_1548);
  std::allocator<char>::~allocator((allocator<char> *)&local_1549);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_13e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_13e1);
  std::__cxx11::string::~string(local_13b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_13b9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_1390);
  std::allocator<char>::~allocator((allocator<char> *)&local_1391);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_1228);
  std::allocator<char>::~allocator((allocator<char> *)&local_1229);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_1200);
  std::allocator<char>::~allocator((allocator<char> *)&local_1201);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_1098);
  std::allocator<char>::~allocator((allocator<char> *)&local_1099);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_1070);
  std::allocator<char>::~allocator((allocator<char> *)&local_1071);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_f08);
  std::allocator<char>::~allocator((allocator<char> *)&local_f09);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_ee0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ee1);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_d78);
  std::allocator<char>::~allocator((allocator<char> *)&local_d79);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_d50);
  std::allocator<char>::~allocator((allocator<char> *)&local_d51);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_be8);
  std::allocator<char>::~allocator((allocator<char> *)&local_be9);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_bc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bc1);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_a58);
  std::allocator<char>::~allocator((allocator<char> *)&local_a59);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_a30);
  std::allocator<char>::~allocator((allocator<char> *)&local_a31);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string((string *)(local_8c9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_8c9);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_8a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a1);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_738);
  std::allocator<char>::~allocator((allocator<char> *)&local_739);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_710);
  std::allocator<char>::~allocator((allocator<char> *)&local_711);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  (**(code **)*local_8)(local_8,local_a0);
  if (((local_61 & 1) == 0) &&
     ((*(float *)(local_10 + 0x6ac) != 0.0 || (NAN(*(float *)(local_10 + 0x6ac)))))) {
    *(undefined1 *)((long)local_10 + 0x343a) = 1;
  }
  else {
    if ((*(byte *)((long)local_10 + 0x3439) & 1) == 0) {
      poVar5 = std::operator<<((ostream *)(local_10 + 0x1c),"only testing");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    *(undefined1 *)((long)local_10 + 0x343a) = 0;
    if ((int)local_10[0x68f] != 0) {
      *(undefined4 *)(local_10 + 0x6ac) = 0;
    }
  }
  plVar2 = local_8;
  if ((((ulong)local_10[0x69] < 2) && ((int)local_10[0x68c] == 0)) ||
     ((*(byte *)((long)local_10 + 0x3457) & 1) != 0)) {
    *(undefined1 *)((long)local_10 + 0x3457) = 1;
  }
  else {
    *(undefined1 *)((long)local_10 + 0x3457) = 0;
  }
  std::allocator<char>::allocator();
  local_1c02 = 0;
  local_1c03 = 0;
  std::__cxx11::string::string(local_1bd8,"min_prediction",&local_1bd9);
  bVar3 = (**(code **)(*plVar2 + 8))(plVar2,local_1bd8);
  plVar2 = local_8;
  local_1f12 = 1;
  if ((bVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    local_1c02 = 1;
    std::__cxx11::string::string(local_1c00,"max_prediction",&local_1c01);
    local_1c03 = 1;
    bVar3 = (**(code **)(*plVar2 + 8))(plVar2,local_1c00);
    local_1f12 = 1;
    if ((bVar3 & 1) == 0) {
      local_1f12 = local_61;
    }
  }
  if ((local_1c03 & 1) != 0) {
    std::__cxx11::string::~string(local_1c00);
  }
  if ((local_1c02 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1c01);
  }
  std::__cxx11::string::~string(local_1bd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bd9);
  plVar2 = local_8;
  if ((local_1f12 & 1) != 0) {
    local_10[8] = (long)noop_mm;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c28,"named_labels",&local_1c29);
  bVar3 = (**(code **)(*plVar2 + 8))(plVar2,local_1c28);
  std::__cxx11::string::~string(local_1c28);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c29);
  if ((bVar3 & 1) != 0) {
    pnVar6 = calloc_or_throw<namedlabels>();
    *(namedlabels **)(*local_10 + 0x70) = pnVar6;
    std::__cxx11::string::string(local_1c50,local_30);
    namedlabels::namedlabels(this,(string *)label_list);
    std::__cxx11::string::~string(local_1c50);
    if ((*(byte *)((long)local_10 + 0x3439) & 1) == 0) {
      poVar5 = std::operator<<((ostream *)(local_10 + 0x1c),"parsed ");
      uVar4 = namedlabels::getK(*(namedlabels **)(*local_10 + 0x70));
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar4);
      poVar5 = std::operator<<(poVar5," named labels");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
  }
  std::__cxx11::string::string(local_1c70,local_50);
  plVar7 = getLossFunction(all_00,&funcName->m_name,function_parameter);
  local_10[0x6a9] = (long)plVar7;
  std::__cxx11::string::~string(local_1c70);
  if (*(float *)(local_10 + 0x65) < 0.0) {
    poVar5 = std::operator<<((ostream *)(local_10 + 0x1c),
                             "l1_lambda should be nonnegative: resetting from ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(float *)(local_10 + 0x65));
    poVar5 = std::operator<<(poVar5," to 0");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    *(undefined4 *)(local_10 + 0x65) = 0;
  }
  if (*(float *)((long)local_10 + 0x32c) < 0.0) {
    poVar5 = std::operator<<((ostream *)(local_10 + 0x1c),
                             "l2_lambda should be nonnegative: resetting from ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(float *)((long)local_10 + 0x32c));
    poVar5 = std::operator<<(poVar5," to 0");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    *(undefined4 *)((long)local_10 + 0x32c) = 0;
  }
  *(uint *)(local_10 + 0x67) = (uint)(0.0 < *(float *)(local_10 + 0x65)) + (int)local_10[0x67];
  iVar1 = 0;
  if (0.0 < *(float *)((long)local_10 + 0x32c)) {
    iVar1 = 2;
  }
  *(int *)(local_10 + 0x67) = iVar1 + (int)local_10[0x67];
  if ((*(byte *)((long)local_10 + 0x3439) & 1) == 0) {
    local_1fb9 = 0;
    if ((int)local_10[0x67] % 2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c90,"bfgs",&local_1c91);
      local_1fb9 = (**(code **)(*local_8 + 8))(local_8,local_1c90);
      local_1fb9 = local_1fb9 ^ 0xff;
      std::__cxx11::string::~string(local_1c90);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c91);
    }
    if ((local_1fb9 & 1) != 0) {
      poVar5 = std::operator<<((ostream *)(local_10 + 0x1c),"using l1 regularization = ");
      pvVar8 = (void *)std::ostream::operator<<(poVar5,*(float *)(local_10 + 0x65));
      std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    }
    if (1 < (int)local_10[0x67]) {
      in_stack_ffffffffffffe010 =
           (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::operator<<((ostream *)(local_10 + 0x1c),"using l2 regularization = ");
      pvVar8 = (void *)std::ostream::operator<<
                                 (in_stack_ffffffffffffe010,*(float *)((long)local_10 + 0x32c));
      std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    }
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffe010);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void parse_example_tweaks(options_i& options, vw& all)
{
  string named_labels;
  string loss_function;
  float loss_parameter = 0.0;
  size_t early_terminate_passes;
  bool test_only = false;

  option_group_definition example_options("Example options");
  example_options.add(make_option("testonly", test_only).short_name("t").help("Ignore label information and just test"))
      .add(make_option("holdout_off", all.holdout_set_off).help("no holdout data in multiple passes"))
      .add(make_option("holdout_period", all.holdout_period).default_value(10).help("holdout period for test only"))
      .add(make_option("holdout_after", all.holdout_after)
               .help("holdout after n training examples, default off (disables holdout_period)"))
      .add(
          make_option("early_terminate", early_terminate_passes)
              .default_value(3)
              .help(
                  "Specify the number of passes tolerated when holdout loss doesn't decrease before early termination"))
      .add(make_option("passes", all.numpasses).help("Number of Training Passes"))
      .add(make_option("initial_pass_length", all.pass_length).help("initial number of examples per pass"))
      .add(make_option("examples", all.max_examples).help("number of examples to parse"))
      .add(make_option("min_prediction", all.sd->min_label).help("Smallest prediction to output"))
      .add(make_option("max_prediction", all.sd->max_label).help("Largest prediction to output"))
      .add(make_option("sort_features", all.p->sort_features)
               .help("turn this on to disregard order in which features have been defined. This will lead to smaller "
                     "cache sizes"))
      .add(make_option("loss_function", loss_function)
               .default_value("squared")
               .help("Specify the loss function to be used, uses squared by default. Currently available ones are "
                     "squared, classic, hinge, logistic, quantile and poisson."))
      .add(make_option("quantile_tau", loss_parameter)
               .default_value(0.5f)
               .help("Parameter \\tau associated with Quantile loss. Defaults to 0.5"))
      .add(make_option("l1", all.l1_lambda).help("l_1 lambda"))
      .add(make_option("l2", all.l2_lambda).help("l_2 lambda"))
      .add(make_option("no_bias_regularization", all.no_bias).help("no bias in regularization"))
      .add(make_option("named_labels", named_labels)
               .keep()
               .help("use names for labels (multiclass, etc.) rather than integers, argument specified all possible "
                     "labels, comma-sep, eg \"--named_labels Noun,Verb,Adj,Punc\""));
  options.add_and_parse(example_options);

  if (test_only || all.eta == 0.)
  {
    if (!all.quiet)
      all.trace_message << "only testing" << endl;
    all.training = false;
    if (all.lda > 0)
      all.eta = 0;
  }
  else
    all.training = true;

  if ((all.numpasses > 1 || all.holdout_after > 0) && !all.holdout_set_off)
    all.holdout_set_off = false;  // holdout is on unless explicitly off
  else
    all.holdout_set_off = true;

  if (options.was_supplied("min_prediction") || options.was_supplied("max_prediction") || test_only)
    all.set_minmax = noop_mm;

  if (options.was_supplied("named_labels"))
  {
    all.sd->ldict = &calloc_or_throw<namedlabels>();
    new (all.sd->ldict) namedlabels(named_labels);
    if (!all.quiet)
      all.trace_message << "parsed " << all.sd->ldict->getK() << " named labels" << endl;
  }

  all.loss = getLossFunction(all, loss_function, loss_parameter);

  if (all.l1_lambda < 0.)
  {
    all.trace_message << "l1_lambda should be nonnegative: resetting from " << all.l1_lambda << " to 0" << endl;
    all.l1_lambda = 0.;
  }
  if (all.l2_lambda < 0.)
  {
    all.trace_message << "l2_lambda should be nonnegative: resetting from " << all.l2_lambda << " to 0" << endl;
    all.l2_lambda = 0.;
  }
  all.reg_mode += (all.l1_lambda > 0.) ? 1 : 0;
  all.reg_mode += (all.l2_lambda > 0.) ? 2 : 0;
  if (!all.quiet)
  {
    if (all.reg_mode % 2 && !options.was_supplied("bfgs"))
      all.trace_message << "using l1 regularization = " << all.l1_lambda << endl;
    if (all.reg_mode > 1)
      all.trace_message << "using l2 regularization = " << all.l2_lambda << endl;
  }
}